

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readMetadata.hpp
# Opt level: O3

Base * __thiscall
njoy::ENDFtk::record::InterpolationBase::
readMetadata<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Base *__return_storage_ptr__,InterpolationBase *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  IllegalN2 exception;
  int local_44;
  int local_40;
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  local_3c [12];
  
  Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
  ::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
              *)__return_storage_ptr__,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it);
  local_44 = MF;
  local_40 = MAT;
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  ::
  TailVerification<int&,int&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,long&>
            (local_3c,(int)lineNumber,&local_40,&local_44,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it,(long *)end);
  if ((__return_storage_ptr__->fields).
      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl < 1) {
    tools::Log::error<char_const*>("Illegal NR value encountered");
    tools::Log::info<char_const*>("NR (or number of regions) must be greater than or equal to 1");
    tools::Log::info<char_const*,long>
              ("NR value: {}",
               (__return_storage_ptr__->fields).
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Head_base<4UL,_long,_false>._M_head_impl);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = getenv;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
  lVar1 = *(long *)&(__return_storage_ptr__->fields).
                    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                    super__Tuple_impl<5UL,_long>;
  if (-1 < lVar1) {
    return __return_storage_ptr__;
  }
  plVar3 = (long *)__cxa_allocate_exception(8);
  *plVar3 = lVar1;
  __cxa_throw(plVar3,&IllegalN2::typeinfo,0);
}

Assistant:

static Base
readMetadata( Iterator& it, const Iterator& end, long& lineNumber,
              int MAT, int MF, int MT ){
  Base metadata( it, end );
  verifyTail( it, end, lineNumber, MAT, MF, MT );
  if ( std::get<4>( metadata.fields ) < 1 ){
    Log::error( "Illegal NR value encountered" );
    Log::info( "NR (or number of regions) must be greater than or equal to 1" );
    Log::info( "NR value: {}", std::get<4>( metadata.fields ) );
    throw std::exception();
  }
  if ( std::get<5>( metadata.fields ) < 0 ){
    IllegalN2 exception( std::get<5>( metadata.fields ) );
    throw exception;
  }
  return metadata;
}